

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O0

bool __thiscall GGSock::FileServer::update(FileServer *this)

{
  bool bVar1;
  pointer pIVar2;
  size_type sVar3;
  element_type *peVar4;
  char *pcVar5;
  reference pvVar6;
  int iVar7;
  int in_R8D;
  reference rVar8;
  lock_guard<std::mutex> lock_1;
  SerializationBuffer buffer_1;
  SerializationBuffer buffer;
  value_type *client_1;
  int64_t pLen;
  int64_t pStart;
  size_type chunkSize;
  value_type *file;
  int i;
  value_type *req;
  value_type *client;
  lock_guard<std::mutex> lock;
  TClientId updateId;
  FileChunkResponseData fileChunkToSend;
  bool doSendFileChunk;
  bool doSendFileInfos;
  bool doListen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  FileChunkResponseData *in_stack_fffffffffffffde0;
  FileChunkResponseData *in_stack_fffffffffffffde8;
  deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
  *in_stack_fffffffffffffdf0;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_fffffffffffffdf8;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
  in_stack_fffffffffffffe00;
  Impl *in_stack_fffffffffffffe10;
  Communicator *in_stack_fffffffffffffe18;
  ulong local_1a8;
  Serialize local_168;
  undefined1 local_160 [24];
  Serialize local_148;
  vector<char,_std::allocator<char>_> local_140;
  reference local_128;
  string local_120 [32];
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  ulong local_d8;
  long local_d0;
  ulong local_c8;
  reference local_c0;
  reference local_b8;
  int local_a4;
  reference local_a0;
  int local_94;
  reference local_90;
  uint local_6c;
  string local_68 [32];
  TChunkId local_48;
  long local_28;
  ulong local_20;
  byte local_13;
  byte local_12;
  byte local_11;
  byte local_1;
  
  local_11 = 0;
  local_12 = 0;
  local_13 = 0;
  FileChunkResponseData::FileChunkResponseData
            ((FileChunkResponseData *)in_stack_fffffffffffffe00._M_current);
  local_6c = 0xffffffff;
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )0x134c8c);
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffde0,
             (mutex_type *)in_stack_fffffffffffffdd8);
  pIVar2 = std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134cb2);
  if ((pIVar2->changedFileInfos & 1U) != 0) {
    std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
    operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                *)0x134cc5);
    Impl::updateFileInfos(in_stack_fffffffffffffe10);
    pIVar2 = std::
             unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
             operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134cdc);
    pIVar2->changedFileInfos = false;
  }
  pIVar2 = std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134d2e);
  if ((pIVar2->changedClientInfos & 1U) != 0) {
    std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
    operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                *)0x134d44);
    Impl::updateClientInfos((Impl *)in_stack_fffffffffffffe00._M_current);
    pIVar2 = std::
             unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
             operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134d5b);
    pIVar2->changedClientInfos = false;
  }
  pIVar2 = std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134d6f);
  local_6c = pIVar2->currentClientUpdateId;
  pIVar2 = std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134d86);
  iVar7 = pIVar2->currentClientUpdateId + 1;
  pIVar2->currentClientUpdateId = iVar7;
  pIVar2 = std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
           ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134da3);
  sVar3 = std::vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>::size
                    (&pIVar2->clients);
  if (iVar7 == (int)sVar3) {
    pIVar2 = std::
             unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
             operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134dca);
    pIVar2->currentClientUpdateId = 0;
  }
  std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
  operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_> *
             )0x134dde);
  local_90 = std::vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>::at
                       ((vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_> *)
                        in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
  if ((local_90->isUpdating & 1U) == 0) {
    pIVar2 = std::
             unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
             operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x134e3f);
    local_11 = pIVar2->isListening & 1;
    local_12 = local_90->sendFileInfos & 1;
    local_90->sendFileInfos = false;
    sVar3 = std::
            deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
            ::size((deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
                    *)0x134e7c);
    if (sVar3 != 0) {
      local_a0 = std::
                 deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
                 ::front(in_stack_fffffffffffffdf0);
      std::__cxx11::string::operator=(local_68,(string *)local_a0);
      local_48 = local_a0->chunkId;
      local_a4 = 0;
      while( true ) {
        iVar7 = local_a4;
        pIVar2 = std::
                 unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                 ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                               *)0x134eee);
        sVar3 = std::
                vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                ::size(&pIVar2->files);
        if ((int)sVar3 <= iVar7) break;
        std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
        operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                    *)0x134f19);
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)
                           in_stack_fffffffffffffe00._M_current,
                           (size_type)in_stack_fffffffffffffdf8._M_current);
        local_b8 = rVar8;
        bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_b8);
        if (bVar1) {
          pIVar2 = std::
                   unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                   ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                                 *)0x134f88);
          local_c0 = std::
                     vector<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                     ::operator[](&pIVar2->files,(long)local_a4);
          bVar1 = std::operator!=(&in_stack_fffffffffffffde0->uri,in_stack_fffffffffffffdd8);
          if (!bVar1) {
            sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_c0->data);
            local_1a8 = sVar3 / (ulong)(long)(local_c0->info).nChunks;
            local_d0 = (long)local_a0->chunkId * local_1a8;
            local_c8 = local_1a8;
            if (local_a0->chunkId == (local_c0->info).nChunks + -1) {
              sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_c0->data);
              local_1a8 = sVar3 - local_d0;
            }
            local_d8 = local_1a8;
            local_28 = local_d0;
            local_20 = local_1a8;
            local_e8 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                         ((vector<char,_std::allocator<char>_> *)
                                          in_stack_fffffffffffffdd8);
            local_e0 = (char *)__gnu_cxx::
                               __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                               ::operator+((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                            *)in_stack_fffffffffffffde8,
                                           (difference_type)in_stack_fffffffffffffde0);
            local_100 = (char *)std::vector<char,_std::allocator<char>_>::begin
                                          ((vector<char,_std::allocator<char>_> *)
                                           in_stack_fffffffffffffdd8);
            local_f8 = (char *)__gnu_cxx::
                               __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                               ::operator+((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                            *)in_stack_fffffffffffffde8,
                                           (difference_type)in_stack_fffffffffffffde0);
            local_f0 = (char *)__gnu_cxx::
                               __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                               ::operator+((__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>
                                            *)in_stack_fffffffffffffde8,
                                           (difference_type)in_stack_fffffffffffffde0);
            std::vector<char,std::allocator<char>>::
            assign<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>,void>
                      ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffdf0,
                       in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
            local_13 = 1;
            break;
          }
        }
        local_a4 = local_a4 + 1;
      }
      std::
      deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
      ::pop_front((deque<GGSock::FileServer::FileChunkRequestData,_std::allocator<GGSock::FileServer::FileChunkRequestData>_>
                   *)in_stack_fffffffffffffde0);
    }
    local_90->isUpdating = true;
    if ((local_90->wasConnected & 1U) != 0) {
      std::__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x13519c);
      bVar1 = Communicator::isConnected((Communicator *)in_stack_fffffffffffffdf0);
      if (!bVar1) {
        printf("Client %d has disconnected\n",(ulong)local_6c);
        local_90->wasConnected = false;
        std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
        operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                    *)0x1351e8);
        Impl::updateClientInfos((Impl *)in_stack_fffffffffffffe00._M_current);
      }
    }
    if ((local_90->wasConnected & 1U) == 0) {
      std::__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x135221);
      bVar1 = Communicator::isConnected((Communicator *)in_stack_fffffffffffffdf0);
      if (bVar1) {
        printf("Client %d has connected\n",(ulong)local_6c);
        local_90->wasConnected = true;
        std::__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x135273);
        Communicator::getPeerAddress_abi_cxx11_(in_stack_fffffffffffffe18);
        std::__cxx11::string::operator=((string *)&(local_90->info).address,local_120);
        std::__cxx11::string::~string(local_120);
        std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
        operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                    *)0x1352ba);
        Impl::updateClientInfos((Impl *)in_stack_fffffffffffffe00._M_current);
      }
    }
    local_94 = 0;
  }
  else {
    local_1 = 0;
    local_94 = 1;
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1352de);
  if (local_94 == 0) {
    std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
    operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                *)0x1352fc);
    local_128 = std::vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>::at
                          ((vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_> *)
                           in_stack_fffffffffffffde0,(size_type)in_stack_fffffffffffffdd8);
    if ((local_11 & 1) == 0) {
      std::__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x135380);
      Communicator::stopListening((Communicator *)in_stack_fffffffffffffdf8._M_current);
    }
    else {
      peVar4 = std::
               __shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x135342);
      pIVar2 = std::
               unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
               ::operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                             *)0x135354);
      Communicator::listen(peVar4,(pIVar2->parameters).listenPort,0);
    }
    if ((local_12 & 1) != 0) {
      SerializationBuffer::SerializationBuffer((SerializationBuffer *)0x1353ac);
      local_148.nBytesProcessed = 0;
      Serialize::Serialize(&local_148);
      std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
      operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                  *)0x1353d7);
      Serialize::operator()
                ((Serialize *)in_stack_fffffffffffffdf0,
                 (map<int,_GGSock::FileServer::FileInfo,_std::less<int>,_std::allocator<std::pair<const_int,_GGSock::FileServer::FileInfo>_>_>
                  *)in_stack_fffffffffffffde8,(SerializationBuffer *)in_stack_fffffffffffffde0);
      peVar4 = std::
               __shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x135403);
      pcVar5 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x13541a);
      sVar3 = std::vector<char,_std::allocator<char>_>::size(&local_140);
      Communicator::send(peVar4,0x65,pcVar5,sVar3 & 0xffffffff,in_R8D);
      std::__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x135455);
      Communicator::update((Communicator *)0x13545d);
      SerializationBuffer::~SerializationBuffer((SerializationBuffer *)0x13546c);
    }
    if ((local_13 & 1) != 0) {
      SerializationBuffer::SerializationBuffer((SerializationBuffer *)0x1354b4);
      local_168.nBytesProcessed = 0;
      Serialize::Serialize(&local_168);
      Serialize::operator()
                ((Serialize *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                 (SerializationBuffer *)in_stack_fffffffffffffde0);
      peVar4 = std::
               __shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1354ff);
      in_stack_fffffffffffffde0 = (FileChunkResponseData *)local_160;
      pcVar5 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x135516);
      sVar3 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffde0);
      Communicator::send(peVar4,0x67,pcVar5,sVar3 & 0xffffffff,in_R8D);
      std::__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x135551);
      Communicator::update((Communicator *)0x135559);
      SerializationBuffer::~SerializationBuffer((SerializationBuffer *)0x135568);
    }
    std::__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<GGSock::Communicator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1355a4);
    Communicator::update((Communicator *)0x1355ac);
    std::unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
    operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                *)0x1355bb);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)in_stack_fffffffffffffde0,
               (mutex_type *)in_stack_fffffffffffffdd8);
    pIVar2 = std::
             unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>::
             operator->((unique_ptr<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
                         *)0x1355e1);
    pvVar6 = std::vector<GGSock::ClientData,_std::allocator<GGSock::ClientData>_>::operator[]
                       (&pIVar2->clients,(long)(int)local_6c);
    pvVar6->isUpdating = false;
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x135606);
    local_1 = 1;
    local_94 = 1;
  }
  FileChunkResponseData::~FileChunkResponseData(in_stack_fffffffffffffde0);
  return (bool)(local_1 & 1);
}

Assistant:

bool FileServer::update() {
    bool doListen = false;
    bool doSendFileInfos = false;
    bool doSendFileChunk = false;

    FileChunkResponseData fileChunkToSend;

    TClientId updateId = -1;

    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        if (m_impl->changedFileInfos) {
            m_impl->updateFileInfos();
            m_impl->changedFileInfos = false;
        }

        if (m_impl->changedClientInfos) {
            m_impl->updateClientInfos();
            m_impl->changedClientInfos = false;
        }

        updateId = m_impl->currentClientUpdateId;

        if (++m_impl->currentClientUpdateId == (int) m_impl->clients.size()) {
            m_impl->currentClientUpdateId = 0;
        }

        auto & client = m_impl->clients.at(updateId);

        if (client.isUpdating) {
            return false;
        }

        doListen = m_impl->isListening;

        doSendFileInfos = client.sendFileInfos;
        client.sendFileInfos = false;

        if (client.fileChunkRequests.size() > 0) {
            const auto & req = client.fileChunkRequests.front();

            // todo : data checks
            fileChunkToSend.uri = req.uri;
            fileChunkToSend.chunkId = req.chunkId;
            for (int i = 0; i < (int) m_impl->files.size(); ++i) {
                if (m_impl->fileUsed[i] == false) {
                    continue;
                }

                const auto & file = m_impl->files[i];
                if (file.info.uri != req.uri) {
                    continue;
                }

                auto chunkSize = file.data.size()/file.info.nChunks;

                int64_t pStart = req.chunkId*chunkSize;
                int64_t pLen = req.chunkId == (file.info.nChunks - 1) ? file.data.size() - pStart : chunkSize;

                fileChunkToSend.pStart = pStart;
                fileChunkToSend.pLen = pLen;
                fileChunkToSend.data.assign(file.data.begin() + pStart, file.data.begin() + pStart + pLen);

                doSendFileChunk = true;

                break;
            }

            client.fileChunkRequests.pop_front();
        }

        client.isUpdating = true;

        if (client.wasConnected && client.communicator->isConnected() == false) {
            printf("Client %d has disconnected\n", updateId);
            client.wasConnected = false;
            m_impl->updateClientInfos();
        }

        if (client.wasConnected == false && client.communicator->isConnected()) {
            printf("Client %d has connected\n", updateId);
            client.wasConnected = true;
            client.info.address = client.communicator->getPeerAddress();
            m_impl->updateClientInfos();
        }
    }

    {
        auto & client = m_impl->clients.at(updateId);
        if (doListen) {
            client.communicator->listen(m_impl->parameters.listenPort, 0);
        } else {
            client.communicator->stopListening();
        }
        if (doSendFileInfos) {
            SerializationBuffer buffer;
            Serialize()(m_impl->fileInfos, buffer);
            client.communicator->send(MsgFileInfosResponse, buffer.data(), (int) buffer.size());
            client.communicator->update();
        }
        if (doSendFileChunk) {
            SerializationBuffer buffer;
            Serialize()(fileChunkToSend, buffer);
            client.communicator->send(MsgFileChunkResponse, buffer.data(), (int) buffer.size());
            client.communicator->update();
        }
        client.communicator->update();
    }

    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);
        m_impl->clients[updateId].isUpdating = false;
    }

    return true;
}